

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_promise_resolve(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int64_t iVar1;
  JSValueUnion JVar2;
  BOOL BVar3;
  JSRefCountHeader *p;
  JSValue func_obj;
  JSValue JVar4;
  JSValue JVar5;
  JSValue resolving_funcs [2];
  
  if ((int)this_val.tag != -1) {
    JS_ThrowTypeErrorNotAnObject(ctx);
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  if ((((magic == 0) && (iVar1 = argv->tag, (int)iVar1 == -1)) &&
      (JVar2 = (JSValueUnion)(argv->u).ptr, *(short *)((long)JVar2.ptr + 6) == 0x2a)) &&
     (*(long *)((long)JVar2.ptr + 0x30) != 0)) {
    JVar4.tag = iVar1;
    JVar4.u.ptr = JVar2.ptr;
    JVar5.tag = iVar1;
    JVar5.u.ptr = JVar2.ptr;
    JVar4 = JS_GetPropertyInternal(ctx,JVar4,0x3c,JVar5,0);
    if ((int)JVar4.tag == 6) {
      return JVar4;
    }
    BVar3 = js_same_value(ctx,JVar4,this_val);
    JS_FreeValue(ctx,JVar4);
    if (BVar3 != 0) {
      JVar4 = *argv;
      if ((uint)argv->tag < 0xfffffff5) {
        return *argv;
      }
      *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
      return JVar4;
    }
  }
  JVar4 = js_new_promise_capability(ctx,resolving_funcs,this_val);
  if ((int)JVar4.tag != 6) {
    func_obj.tag = resolving_funcs[magic].tag;
    func_obj.u.ptr = resolving_funcs[magic].u.ptr;
    JVar5 = JS_Call(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),1,argv);
    JS_FreeValue(ctx,resolving_funcs[0]);
    JS_FreeValue(ctx,resolving_funcs[1]);
    if ((int)JVar5.tag == 6) {
      JS_FreeValue(ctx,JVar4);
      JVar4 = JVar5;
    }
    else {
      JS_FreeValue(ctx,JVar5);
    }
  }
  return JVar4;
}

Assistant:

static JSValue js_promise_resolve(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv, int magic)
{
    JSValue result_promise, resolving_funcs[2], ret;
    BOOL is_reject = magic;

    if (!JS_IsObject(this_val))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    if (!is_reject && JS_GetOpaque(argv[0], JS_CLASS_PROMISE)) {
        JSValue ctor;
        BOOL is_same;
        ctor = JS_GetProperty(ctx, argv[0], JS_ATOM_constructor);
        if (JS_IsException(ctor))
            return ctor;
        is_same = js_same_value(ctx, ctor, this_val);
        JS_FreeValue(ctx, ctor);
        if (is_same)
            return JS_DupValue(ctx, argv[0]);
    }
    result_promise = js_new_promise_capability(ctx, resolving_funcs, this_val);
    if (JS_IsException(result_promise))
        return result_promise;
    ret = JS_Call(ctx, resolving_funcs[is_reject], JS_UNDEFINED, 1, argv);
    JS_FreeValue(ctx, resolving_funcs[0]);
    JS_FreeValue(ctx, resolving_funcs[1]);
    if (JS_IsException(ret)) {
        JS_FreeValue(ctx, result_promise);
        return ret;
    }
    JS_FreeValue(ctx, ret);
    return result_promise;
}